

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

float Scl_LibertyReadDefaultMaxTrans(Scl_Tree_t *p)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  double dVar7;
  float local_3c;
  
  pSVar2 = p->pItems;
  uVar3 = pSVar2->Child;
  iVar1 = p->nItems;
  if ((int)uVar3 < iVar1) {
    local_3c = 0.0;
    if (-1 < (int)uVar3) {
      pcVar6 = p->pContents;
      while (iVar5 = pSVar2[uVar3].Key.Beg, iVar4 = pSVar2[uVar3].Key.End - iVar5,
            iVar5 = strncmp(pcVar6 + iVar5,"default_max_transition",(long)iVar4),
            iVar4 != 0x16 || iVar5 != 0) {
        uVar3 = pSVar2[uVar3].Next;
        if (iVar1 <= (int)uVar3) goto LAB_003d06f9;
        if ((int)uVar3 < 0) {
          return 0.0;
        }
        if (pSVar2 == (Scl_Item_t *)0x0) {
          return 0.0;
        }
      }
      pcVar6 = Scl_LibertyReadString(p,pSVar2[uVar3].Head);
      dVar7 = atof(pcVar6);
      local_3c = (float)dVar7;
    }
    return local_3c;
  }
LAB_003d06f9:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

float Scl_LibertyReadDefaultMaxTrans( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "default_max_transition" )
        return atof(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}